

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O1

shared_ptr<gui::TextBoxStyle> __thiscall gui::DefaultTheme::makeTextBoxStyle(DefaultTheme *this)

{
  float fVar1;
  Gui *__args;
  TextBoxStyle *this_00;
  uint uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::TextBoxStyle> sVar3;
  Vector3f local_30;
  
  __args = *(Gui **)(in_RSI + 8);
  (this->super_Theme)._vptr_Theme = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gui::TextBoxStyle,std::allocator<gui::TextBoxStyle>,gui::Gui_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Theme).gui_,
             (TextBoxStyle **)this,(allocator<gui::TextBoxStyle> *)&local_30,__args);
  TextBoxStyle::setFillColor
            ((TextBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::White);
  TextBoxStyle::setOutlineColor
            ((TextBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray);
  TextBoxStyle::setOutlineThickness((TextBoxStyle *)(this->super_Theme)._vptr_Theme,-1.0);
  TextBoxStyle::setFont((TextBoxStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48));
  TextBoxStyle::setCharacterSize((TextBoxStyle *)(this->super_Theme)._vptr_Theme,0xf);
  TextBoxStyle::setTextFillColor
            ((TextBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  TextBoxStyle::setReadOnlyFillColor
            ((TextBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightGray2);
  TextBoxStyle::setDefaultTextFillColor
            ((TextBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray3);
  this_00 = (TextBoxStyle *)(this->super_Theme)._vptr_Theme;
  fVar1 = *(float *)(in_RSI + 0x50);
  uVar2 = TextBoxStyle::getCharacterSize(this_00);
  local_30.y = fVar1 * (float)uVar2;
  local_30.x = 2.0;
  TextBoxStyle::setCaretSize(this_00,(Vector2f *)&local_30);
  TextBoxStyle::setCaretFillColor
            ((TextBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorDarkBlue);
  local_30.z = *(float *)(in_RSI + 0x50);
  local_30.x = 8.0;
  local_30.y = 1.0;
  TextBoxStyle::setTextPadding((TextBoxStyle *)(this->super_Theme)._vptr_Theme,&local_30);
  sVar3.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::TextBoxStyle>)
         sVar3.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBoxStyle> DefaultTheme::makeTextBoxStyle() const {
    auto style = std::make_shared<TextBoxStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(colorGray);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setReadOnlyFillColor(colorLightGray2);
    style->setDefaultTextFillColor(colorGray3);
    style->setCaretSize({2.0f, fontMaxHeightRatio_ * style->getCharacterSize()});
    style->setCaretFillColor(colorDarkBlue);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}